

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void parasail_profile_free(parasail_profile_t *profile)

{
  void *pvVar1;
  
  if (profile != (parasail_profile_t *)0x0) {
    pvVar1 = (profile->profile8).score;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile8).matches;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile8).similar;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile16).score;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile16).matches;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile16).similar;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile32).score;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile32).matches;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile32).similar;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile64).score;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile64).matches;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    pvVar1 = (profile->profile64).similar;
    if (pvVar1 != (void *)0x0) {
      (*profile->free)(pvVar1);
    }
    free(profile);
    return;
  }
  parasail_profile_free_cold_1();
  return;
}

Assistant:

void parasail_profile_free(parasail_profile_t *profile)
{
    if (!profile) {
        fprintf(stderr, "%s: attempted free of NULL profile pointer\n", __func__);
        return;
    }

    if (NULL != profile->profile8.score) {
        profile->free(profile->profile8.score);
    }
    if (NULL != profile->profile8.matches) {
        profile->free(profile->profile8.matches);
    }
    if (NULL != profile->profile8.similar) {
        profile->free(profile->profile8.similar);
    }

    if (NULL != profile->profile16.score) {
        profile->free(profile->profile16.score);
    }
    if (NULL != profile->profile16.matches) {
        profile->free(profile->profile16.matches);
    }
    if (NULL != profile->profile16.similar) {
        profile->free(profile->profile16.similar);
    }

    if (NULL != profile->profile32.score) {
        profile->free(profile->profile32.score);
    }
    if (NULL != profile->profile32.matches) {
        profile->free(profile->profile32.matches);
    }
    if (NULL != profile->profile32.similar) {
        profile->free(profile->profile32.similar);
    }

    if (NULL != profile->profile64.score) {
        profile->free(profile->profile64.score);
    }
    if (NULL != profile->profile64.matches) {
        profile->free(profile->profile64.matches);
    }
    if (NULL != profile->profile64.similar) {
        profile->free(profile->profile64.similar);
    }

    free(profile);
}